

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O3

void PatchAlterNigelColors::fix_sword_shade(ROM *rom)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  Sprite nigel_frame_60;
  Sprite nigel_frame_62;
  Sprite nigel_frame_32;
  Sprite nigel_frame_23;
  Sprite nigel_frame_39;
  Sprite nigel_frame_37;
  Sprite nigel_frame_36;
  Sprite nigel_frame_35;
  Sprite nigel_frame_33;
  Sprite nigel_frame_18;
  Sprite nigel_frame_16;
  Sprite nigel_frame_10;
  uint8_t *in_stack_fffffffffffffc08;
  allocator_type local_3e9;
  Sprite local_3e8;
  ByteArray local_3b8;
  Sprite local_398;
  Sprite local_368;
  Sprite local_338;
  Sprite local_308;
  Sprite local_2d8;
  Sprite local_2a8;
  Sprite local_278;
  Sprite local_248;
  Sprite local_218;
  Sprite local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Sprite local_40;
  
  fix_sword_shade_frame(rom,0x1220ae,'\v');
  fix_sword_shade_frame(rom,0x122a7c,'\v');
  fix_sword_shade_frame(rom,0x122d1a,'\v');
  fix_sword_shade_frame(rom,0x122f62,'\v');
  fix_sword_shade_frame(rom,0x1231a0,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::replace_color_in_tile(&local_40,'\t','\x06','\v');
  Sprite::set_pixel(&local_40,'\n','\a','\x06','\x06');
  Sprite::set_pixel(&local_40,'\n','\x06','\a','\x06');
  Sprite::encode((ByteArray *)&local_1e8,&local_40);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1233a8,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x123626,'\v');
  fix_sword_shade_frame(rom,0x123fa8,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::replace_color_in_tile(&local_1e8,'\t','\x06','\v');
  Sprite::set_pixel(&local_1e8,'\v','\0','\x02','\t');
  Sprite::encode((ByteArray *)&local_218,&local_1e8);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124200,&local_78);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::replace_color_in_tile(&local_218,'\t','\x06','\x06');
  Sprite::set_pixel(&local_218,'\n','\x03','\a','\x06');
  Sprite::replace_color_in_tile(&local_218,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_338,&local_218);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124694,&local_98);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x12493c,'\v');
  fix_sword_shade_frame(rom,0x124be2,'\v');
  fix_sword_shade_frame(rom,0x12510a,'\x0f');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_338,'\x0f','\x05','\0','\x06');
  Sprite::set_pixel(&local_338,'\x0f','\x05','\x01','\x06');
  Sprite::set_pixel(&local_338,'\x0f','\x06','\x01','\x06');
  Sprite::set_pixel(&local_338,'\x0f','\x06','\x02','\x06');
  Sprite::encode((ByteArray *)&local_368,&local_338);
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x125370,&local_b8);
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x125616,'\v');
  local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_248._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_248;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_368._data,__l,(allocator_type *)&local_278);
  fix_sword_shade_frame(rom,0x1258c2,&local_368._data);
  if (local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x125b70,'\v');
  fix_sword_shade_frame(rom,0x125e24,'\v');
  fix_sword_shade_frame(rom,0x1260da,'\v');
  fix_sword_shade_frame(rom,0x126374,'\v');
  fix_sword_shade_frame(rom,0x1265e8,'\v');
  fix_sword_shade_frame(rom,0x126866,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_368,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_368,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&local_368,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&local_248,&local_368);
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126ac4,&local_d8);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_248,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_248,'\v','\x05','\0','\x06');
  Sprite::encode((ByteArray *)&local_278,&local_248);
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126d66,&local_f8);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x12700c,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_278,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&local_278,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_2a8,&local_278);
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1272ac,&local_118);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_2a8,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_2a8,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&local_2a8,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&local_2d8,&local_2a8);
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127546,&local_138);
  if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_2d8,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&local_2d8,'\n','\x06','\x06','\x06');
  Sprite::set_pixel(&local_2d8,'\v','\x04','\0','\x06');
  Sprite::encode((ByteArray *)&local_308,&local_2d8);
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1277d0,&local_158);
  if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x127a50,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_308,'\v','\x06','\x01','\x06');
  Sprite::set_pixel(&local_308,'\v','\x05','\x02','\x06');
  Sprite::set_pixel(&local_308,'\v','\x04','\x03','\x06');
  Sprite::encode((ByteArray *)&local_3e8,&local_308);
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127cc8,&local_178);
  if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x127f28,'\n');
  fix_sword_shade_frame(rom,0x128126,'\n');
  fix_sword_shade_frame(rom,0x128340,'\n');
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_398._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3e8._data,__l_00,(allocator_type *)&local_3b8);
  fix_sword_shade_frame(rom,0x12859a,&local_3e8._data);
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x1287fa,'\n');
  fix_sword_shade_frame(rom,0x128a10,'\n');
  fix_sword_shade_frame(rom,0x128c36,'\n');
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_398._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3e8._data,__l_01,(allocator_type *)&local_3b8);
  fix_sword_shade_frame(rom,0x128e6c,&local_3e8._data);
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(local_398._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xf0e0a);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3e8._data,__l_02,(allocator_type *)&local_3b8);
  fix_sword_shade_frame(rom,0x1290c4,&local_3e8._data);
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x129324,'\n');
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(local_398._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xb0a06);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3e8._data,__l_03,(allocator_type *)&local_3b8);
  fix_sword_shade_frame(rom,0x1295d2,&local_3e8._data);
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_3e8,'\n','\x01','\a','\x06');
  Sprite::set_pixel(&local_3e8,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&local_3e8,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&local_3e8,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_398,&local_3e8);
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12b990,&local_198);
  if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT62(local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_3b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398._data,__l_04,&local_3e9);
  fix_sword_shade_frame(rom,0x12bb9e,&local_398._data);
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc08);
  Sprite::set_pixel(&local_398,'\n','\x02','\a','\x06');
  Sprite::replace_color_in_tile(&local_398,'\t','\x06','\v');
  Sprite::encode(&local_3b8,&local_398);
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12bdfe,&local_1b8);
  if (local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_368._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_338._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40._subsprites.super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void fix_sword_shade(md::ROM& rom)
    {
        fix_sword_shade_frame(rom, 0x1220AE, 11); // SpriteGfx000Frame02
        fix_sword_shade_frame(rom, 0x122A7C, 11); // SpriteGfx000Frame06
        fix_sword_shade_frame(rom, 0x122D1A, 11); // SpriteGfx000Frame07
        fix_sword_shade_frame(rom, 0x122F62, 11); // SpriteGfx000Frame08
        fix_sword_shade_frame(rom, 0x1231A0, 11); // SpriteGfx000Frame09

        Sprite nigel_frame_10 = Sprite::decode_from(rom.iterator_at(0x1233A8));
        nigel_frame_10.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_10.set_pixel(10, 7, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_10.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1233A8, nigel_frame_10.encode());

        fix_sword_shade_frame(rom, 0x123626, 11); // SpriteGfx000Frame11
        fix_sword_shade_frame(rom, 0x123FA8, 11); // SpriteGfx000Frame15

        Sprite nigel_frame_16 = Sprite::decode_from(rom.iterator_at(0x124200));
        nigel_frame_16.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_16.set_pixel(11, 0, 2, COLOR_SWORD_WRONG);
        rom.set_bytes(0x124200, nigel_frame_16.encode());

        Sprite nigel_frame_18 = Sprite::decode_from(rom.iterator_at(0x124694));
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 6);
        nigel_frame_18.set_pixel(10, 3, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x124694, nigel_frame_18.encode());

        fix_sword_shade_frame(rom, 0x12493C, 11); // SpriteGfx000Frame19
        fix_sword_shade_frame(rom, 0x124BE2, 11); // SpriteGfx000Frame20

        // --- Anim dropping held item, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x12510A, 15); // SpriteGfx000Frame22

        Sprite nigel_frame_23 = Sprite::decode_from(rom.iterator_at(0x125370));
        nigel_frame_23.set_pixel(15, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 5, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 2, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x125370, nigel_frame_23.encode());

        // --- Anim held item, not looking camera ----------------------------
        fix_sword_shade_frame(rom, 0x125616, 11); // SpriteGfx000Frame24
        fix_sword_shade_frame(rom, 0x1258C2, {10, 11}); // SpriteGfx000Frame25
        fix_sword_shade_frame(rom, 0x125B70, 11); // SpriteGfx000Frame26
        fix_sword_shade_frame(rom, 0x125E24, 11); // SpriteGfx000Frame27
        fix_sword_shade_frame(rom, 0x1260DA, 11); // SpriteGfx000Frame28
        fix_sword_shade_frame(rom, 0x126374, 11); // SpriteGfx000Frame29
        fix_sword_shade_frame(rom, 0x1265E8, 11); // SpriteGfx000Frame30
        fix_sword_shade_frame(rom, 0x126866, 11); // SpriteGfx000Frame31

        // --- Anim held item, facing camera ----------------------------
        Sprite nigel_frame_32 = Sprite::decode_from(rom.iterator_at(0x126AC4));
        nigel_frame_32.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126AC4, nigel_frame_32.encode());

        Sprite nigel_frame_33 = Sprite::decode_from(rom.iterator_at(0x126D66));
        nigel_frame_33.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_33.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126D66, nigel_frame_33.encode());

        fix_sword_shade_frame(rom, 0x12700C, 11); // SpriteGfx000Frame34

        Sprite nigel_frame_35 = Sprite::decode_from(rom.iterator_at(0x1272AC));
        nigel_frame_35.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_35.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x1272AC, nigel_frame_35.encode());

        Sprite nigel_frame_36 = Sprite::decode_from(rom.iterator_at(0x127546));
        nigel_frame_36.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127546, nigel_frame_36.encode());

        Sprite nigel_frame_37 = Sprite::decode_from(rom.iterator_at(0x1277D0));
        nigel_frame_37.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(10, 6, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(11, 4, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1277D0, nigel_frame_37.encode());

        fix_sword_shade_frame(rom, 0x127A50, 11); // SpriteGfx000Frame38

        Sprite nigel_frame_39 = Sprite::decode_from(rom.iterator_at(0x127CC8));
        nigel_frame_39.set_pixel(11, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 5, 2, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 4, 3, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127CC8, nigel_frame_39.encode());

        // --- Anim jumping, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x127F28, 10); // SpriteGfx000Frame40
        fix_sword_shade_frame(rom, 0x128126, 10); // SpriteGfx000Frame41

        // --- Anim jumping, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128340, 10); // SpriteGfx000Frame42
        fix_sword_shade_frame(rom, 0x12859A, {10, 11}); // SpriteGfx000Frame43

        // --- Anim jumping holding something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1287FA, 10); // SpriteGfx000Frame44
        fix_sword_shade_frame(rom, 0x128A10, 10); // SpriteGfx000Frame45

        // --- Anim jumping holding something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128C36, 10); // SpriteGfx000Frame46
        fix_sword_shade_frame(rom, 0x128E6C, {10, 11}); // SpriteGfx000Frame47

        // --- Anim jumping throwing something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1290C4, {10, 14, 15}); // SpriteGfx000Frame48
        fix_sword_shade_frame(rom, 0x129324, 10); // SpriteGfx000Frame49

        // --- Anim jumping throwing something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x1295D2, {6, 10, 11}); // SpriteGfx000Frame50

        // --- Anim climbing, not looking at camera ----------------------------
        Sprite nigel_frame_60 = Sprite::decode_from(rom.iterator_at(0x12B990));
        nigel_frame_60.set_pixel(10, 1, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12B990, nigel_frame_60.encode());

        fix_sword_shade_frame(rom, 0x12BB9E, {10, 11}); // SpriteGfx000Frame61

        Sprite nigel_frame_62 = Sprite::decode_from(rom.iterator_at(0x12BDFE));
        nigel_frame_62.set_pixel(10, 2, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_62.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12BDFE, nigel_frame_62.encode());
    }